

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_decoder.c
# Opt level: O3

aom_image_t * aom_codec_get_frame(aom_codec_ctx_t *ctx,aom_codec_iter_t *iter)

{
  aom_image_t *paVar1;
  
  if (((iter != (aom_codec_iter_t *)0x0 && ctx != (aom_codec_ctx_t *)0x0) &&
      (ctx->iface != (aom_codec_iface_t *)0x0)) &&
     ((aom_codec_alg_priv_t_conflict *)ctx->priv != (aom_codec_alg_priv_t_conflict *)0x0)) {
    paVar1 = (*(ctx->iface->dec).get_frame)((aom_codec_alg_priv_t_conflict *)ctx->priv,iter);
    return paVar1;
  }
  return (aom_image_t *)0x0;
}

Assistant:

aom_image_t *aom_codec_get_frame(aom_codec_ctx_t *ctx, aom_codec_iter_t *iter) {
  aom_image_t *img;

  if (!ctx || !iter || !ctx->iface || !ctx->priv)
    img = NULL;
  else
    img = ctx->iface->dec.get_frame(get_alg_priv(ctx), iter);

  return img;
}